

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  int iVar1;
  pointer puVar2;
  __uniq_ptr_data<wabt::Command,_std::default_delete<wabt::Command>,_true,_true> _Var3;
  Index IVar4;
  
  IVar4 = BindingHash::FindIndex(&this->module_bindings,var);
  puVar2 = (this->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)IVar4 <
      (ulong)((long)(this->commands).
                    super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
    _Var3.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl =
         puVar2[IVar4]._M_t.
         super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>;
    iVar1 = *(int *)((long)_Var3.
                           super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                           .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 8);
    if ((iVar1 == 1) || (iVar1 == 0)) {
      return (Module *)
             ((long)_Var3.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 0x10);
    }
  }
  return (Module *)0x0;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = commands[index].get();
  if (isa<ModuleCommand>(command)) {
    return &cast<ModuleCommand>(command)->module;
  } else if (isa<ScriptModuleCommand>(command)) {
    return &cast<ScriptModuleCommand>(command)->module;
  }
  return nullptr;
}